

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall CVmObjBigNum::abs_val(CVmObjBigNum *this,vm_val_t *retval,vm_obj_id_t self)

{
  void *__src;
  int iVar1;
  vm_obj_id_t obj;
  vm_val_t *this_00;
  char *ext;
  size_t __n;
  vm_obj_id_t in_EDX;
  vm_val_t *in_RSI;
  long in_RDI;
  char *new_ext;
  size_t prec;
  undefined8 in_stack_ffffffffffffffb0;
  int in_root_set;
  char *__dest;
  undefined8 local_40;
  
  in_root_set = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  iVar1 = get_neg(*(char **)(in_RDI + 8));
  if (iVar1 == 0) {
LAB_002b8f60:
    vm_val_t::set_obj(in_RSI,in_EDX);
  }
  else {
    iVar1 = get_type(*(char **)(in_RDI + 8));
    if (iVar1 != 0) {
      iVar1 = get_type(*(char **)(in_RDI + 8));
      if (iVar1 != 4) goto LAB_002b8f60;
    }
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_EDX);
    iVar1 = is_infinity((char *)0x2b8f9a);
    if (iVar1 == 0) {
      local_40 = get_prec((char *)0x2b8fb9);
    }
    else {
      local_40 = 1;
    }
    obj = create(in_root_set,(size_t)in_RSI);
    vm_val_t::set_obj(in_RSI,obj);
    ext = get_objid_ext(0);
    __src = *(void **)(in_RDI + 8);
    __dest = ext;
    __n = calc_alloc(local_40);
    memcpy(__dest,__src,__n);
    set_neg(ext,0);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjBigNum::abs_val(VMG_ vm_val_t *retval, vm_obj_id_t self)
{
    /* 
     *   If I'm not an ordinary number or an infinity, or I'm already
     *   non-negative, return myself unchanged.  Note that we change negative
     *   infinity to infinity, even though this might not make a great deal
     *   of sense mathematically.  
     */
    if (!get_neg(ext_)
        || (get_type(ext_) != VMBN_T_NUM && get_type(ext_) != VMBN_T_INF))
    {
        retval->set_obj(self);
        return TRUE;
    }

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* 
     *   if I'm negative infinity, we don't need any precision in the new
     *   value; otherwise use my original precision
     */
    size_t prec = (is_infinity(ext_) ? 1 : get_prec(ext_));

    /* create a new number with the same precision as the original */
    retval->set_obj(create(vmg_ FALSE, prec));
    char *new_ext = get_objid_ext(vmg_ retval->val.obj);

    /* make a copy in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* set the sign to positive */
    set_neg(new_ext, FALSE);

    /* remove my self-reference */
    G_stk->discard();

    /* success */
    return TRUE;
}